

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_simplex.h
# Opt level: O2

void __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>::
union_vertices(Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
               *this,Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
                     *a)

{
  vector<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  v;
  _Vector_base<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  local_28;
  
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_start = (Vertex_handle *)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (Vertex_handle *)0x0;
  std::
  vector<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  ::reserve((vector<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
             *)&local_28,
            (a->simplex_set)._M_t._M_impl.super__Rb_tree_header._M_node_count +
            (this->simplex_set)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  __set_union<std::_Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::_Rb_tree_const_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::back_insert_iterator<std::vector<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((this->simplex_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             &(this->simplex_set)._M_t._M_impl.super__Rb_tree_header,
             (a->simplex_set)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             &(a->simplex_set)._M_t._M_impl.super__Rb_tree_header,&local_28);
  std::
  _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  ::clear((_Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
           *)this);
  std::
  _Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>>
  ::
  _M_insert_range_unique<__gnu_cxx::__normal_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle*,std::vector<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>>>>
            ((_Rb_tree<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,std::_Identity<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::less<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>,std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>>
              *)this,(__normal_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle_*,_std::vector<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>
                      )local_28._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle_*,_std::vector<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>_>
              )local_28._M_impl.super__Vector_impl_data._M_finish);
  std::
  _Vector_base<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle,_std::allocator<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>_>
  ::~_Vector_base(&local_28);
  return;
}

Assistant:

void union_vertices(const Skeleton_blocker_simplex & a) {
    std::vector<T> v;
    v.reserve(simplex_set.size() + a.simplex_set.size());

    set_union(simplex_set.begin(), simplex_set.end(), a.simplex_set.begin(),
              a.simplex_set.end(), std::back_inserter(v));
    clear();
    simplex_set.insert(v.begin(), v.end());
  }